

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isGatherOffsetsResultValid
               (Texture2DArrayView *texture,Sampler *sampler,IntLookupPrecision *prec,Vec3 *coord,
               int componentNdx,IVec2 (*offsets) [4],IVec4 *result)

{
  bool bVar1;
  int iVar2;
  int coordZ;
  bool bVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec2 local_38;
  
  if (texture->m_numLevels < 1) {
    iVar5 = -1;
  }
  else {
    iVar5 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  fVar8 = coord->m_data[2];
  fVar6 = TexVerifierUtil::computeFloatingPointError(fVar8,(prec->coordBits).m_data[2]);
  fVar7 = floorf((fVar8 - fVar6) + 0.5);
  iVar4 = (int)fVar7;
  fVar8 = ceilf(fVar8 + fVar6 + 0.5);
  iVar2 = (int)fVar8 + -1;
  coordZ = iVar5;
  if (iVar4 < iVar5) {
    coordZ = iVar4;
  }
  if (iVar4 < 0) {
    coordZ = 0;
  }
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  if (iVar2 < 0) {
    iVar5 = 0;
  }
  bVar3 = coordZ <= iVar5;
  if (coordZ <= iVar5) {
    local_38.m_data = *(float (*) [2])coord->m_data;
    bVar1 = isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
                      (texture->m_levels,sampler,prec,&local_38,coordZ,componentNdx,offsets,result);
    bVar3 = true;
    while (!bVar1) {
      coordZ = coordZ + 1;
      bVar3 = coordZ <= iVar5;
      if (iVar5 < coordZ) {
        return bVar3;
      }
      local_38.m_data = *(float (*) [2])coord->m_data;
      bVar1 = isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
                        (texture->m_levels,sampler,prec,&local_38,coordZ,componentNdx,offsets,result
                        );
    }
  }
  return bVar3;
}

Assistant:

bool isGatherOffsetsResultValid (const Texture2DArrayView&		texture,
								 const Sampler&					sampler,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 int							componentNdx,
								 const IVec2					(&offsets)[4],
								 const IVec4&					result)
{
	return is2DArrayGatherOffsetsResultValid(texture, sampler, prec, coord, componentNdx, offsets, result);
}